

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

bool __thiscall QPDF::JSONReactor::dictionaryItem(JSONReactor *this,string *key,JSON *value)

{
  shared_ptr<InputSource> *this_00;
  QPDF *qpdf;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  qpdf_offset_t qVar4;
  pointer pMVar5;
  char *str;
  logic_error *plVar6;
  _Atomic_word *p_Var7;
  string local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d8 [24];
  string local_4c0;
  byte local_499;
  string local_498;
  QPDFObjectHandle local_478;
  string local_468;
  QPDFObjectHandle local_448;
  undefined1 local_438 [8];
  QPDFObjectHandle dict;
  value_type *tos_2;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  undefined1 local_3b0 [8];
  string filename;
  function<void_(Pipeline_*)> local_380;
  long local_360;
  qpdf_offset_t end;
  qpdf_offset_t start;
  string local_348;
  allocator<char> local_321;
  string local_320;
  undefined1 local_300 [8];
  string v_4;
  string local_2c8;
  undefined1 auStack_2a8 [8];
  QPDFObjectHandle uninitialized;
  value_type *tos_1;
  string local_288;
  undefined1 local_268 [24];
  string local_250;
  QPDFObjectHandle local_230;
  QPDFObjGen local_220;
  Stream local_218;
  BaseHandle local_208;
  undefined1 local_1f8 [24];
  value_type *tos;
  string local_1d8;
  shared_ptr<QPDFObject> local_1b8;
  QPDFObjectHandle local_1a8;
  int local_194;
  int local_190;
  int gen;
  int obj;
  bool local_162;
  allocator<char> local_161;
  undefined1 local_160 [6];
  bool v_3;
  bool local_13a;
  allocator<char> local_139;
  undefined1 local_138 [6];
  bool v_2;
  string local_118 [8];
  string version_1;
  undefined1 local_f0 [7];
  bool okay_1;
  string v_1;
  string local_c8;
  char *local_a8;
  char *p;
  string version;
  undefined1 local_78 [7];
  bool okay;
  string v;
  string local_50;
  state_e local_30;
  state_e state;
  JSON *local_20;
  JSON *value_local;
  string *key_local;
  JSONReactor *this_local;
  
  local_20 = value;
  value_local = (JSON *)key;
  key_local = (string *)this;
  bVar1 = std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
          ::empty(&this->stack);
  if (bVar1) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"stack is empty in dictionaryItem");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this->next_state = st_ignore;
  pvVar3 = std::
           vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
           back(&this->stack);
  local_30 = pvVar3->state;
  if (local_30 == st_ignore) {
    QTC::TC("qpdf","QPDF_json ignoring in st_ignore",0);
  }
  else if (local_30 == st_top) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"qpdf");
    if (bVar1) {
      this->saw_qpdf = true;
      bVar1 = JSON::isArray(local_20);
      if (bVar1) {
        this->next_state = st_qpdf;
      }
      else {
        QTC::TC("qpdf","QPDF_json qpdf not array",0);
        qVar4 = JSON::getStart(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"\"qpdf\" must be an array",
                   (allocator<char> *)(v.field_2._M_local_buf + 0xf));
        error(this,qVar4,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator((allocator<char> *)(v.field_2._M_local_buf + 0xf));
      }
    }
    else {
      QTC::TC("qpdf","QPDF_json ignoring unknown top-level key",0);
    }
  }
  else if (local_30 == st_qpdf_meta) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"pdfversion");
    if (bVar1) {
      this->saw_pdf_version = true;
      std::__cxx11::string::string((string *)local_78);
      version.field_2._M_local_buf[0xf] = '\0';
      bVar1 = JSON::getString(local_20,(string *)local_78);
      if (bVar1) {
        std::__cxx11::string::string((string *)&p);
        local_a8 = (char *)std::__cxx11::string::c_str();
        bVar1 = validatePDFVersion(&local_a8,(string *)&p);
        if ((bVar1) && (*local_a8 == '\0')) {
          pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->pdf->m);
          std::__cxx11::string::operator=((string *)&pMVar5->pdf_version,(string *)&p);
          version.field_2._M_local_buf[0xf] = '\x01';
        }
        std::__cxx11::string::~string((string *)&p);
      }
      if ((version.field_2._M_local_buf[0xf] & 1U) == 0) {
        QTC::TC("qpdf","QPDF_json bad pdf version",0);
        qVar4 = JSON::getStart(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"invalid PDF version (must be \"x.y\")",
                   (allocator<char> *)(v_1.field_2._M_local_buf + 0xf));
        error(this,qVar4,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)(v_1.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::~string((string *)local_78);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"jsonversion");
      if (bVar1) {
        this->saw_json_version = true;
        std::__cxx11::string::string((string *)local_f0);
        version_1.field_2._M_local_buf[0xf] = '\0';
        bVar1 = JSON::getNumber(local_20,(string *)local_f0);
        if (bVar1) {
          std::__cxx11::string::string(local_118);
          str = (char *)std::__cxx11::string::c_str();
          iVar2 = QUtil::string_to_int(str);
          if (iVar2 == 2) {
            version_1.field_2._M_local_buf[0xf] = '\x01';
          }
          std::__cxx11::string::~string(local_118);
        }
        if ((version_1.field_2._M_local_buf[0xf] & 1U) == 0) {
          QTC::TC("qpdf","QPDF_json bad json version",0);
          qVar4 = JSON::getStart(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_138,"invalid JSON version (must be numeric value 2)",&local_139
                    );
          error(this,qVar4,(string *)local_138);
          std::__cxx11::string::~string((string *)local_138);
          std::allocator<char>::~allocator(&local_139);
        }
        std::__cxx11::string::~string((string *)local_f0);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,"pushedinheritedpageresources");
        if (bVar1) {
          bVar1 = JSON::getBool(local_20,&local_13a);
          if (bVar1) {
            if (((this->must_be_complete & 1U) == 0) && ((local_13a & 1U) != 0)) {
              pushInheritedAttributesToPage(this->pdf);
            }
          }
          else {
            QTC::TC("qpdf","QPDF_json bad pushedinheritedpageresources",0);
            qVar4 = JSON::getStart(local_20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_160,"pushedinheritedpageresources must be a boolean",
                       &local_161);
            error(this,qVar4,(string *)local_160);
            std::__cxx11::string::~string((string *)local_160);
            std::allocator<char>::~allocator(&local_161);
          }
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value_local,"calledgetallpages");
          if (bVar1) {
            bVar1 = JSON::getBool(local_20,&local_162);
            if (bVar1) {
              if (((this->must_be_complete & 1U) == 0) && ((local_162 & 1U) != 0)) {
                getAllPages(this->pdf);
              }
            }
            else {
              QTC::TC("qpdf","QPDF_json bad calledgetallpages",0);
              qVar4 = JSON::getStart(local_20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&obj,"calledgetallpages must be a boolean",
                         (allocator<char> *)((long)&gen + 3));
              error(this,qVar4,(string *)&obj);
              std::__cxx11::string::~string((string *)&obj);
              std::allocator<char>::~allocator((allocator<char> *)((long)&gen + 3));
            }
          }
          else {
            QTC::TC("qpdf","QPDF_json ignore second-level key",0);
          }
        }
      }
    }
  }
  else if (local_30 == st_objects) {
    local_190 = 0;
    local_194 = 0;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"trailer");
    if (bVar1) {
      this->saw_trailer = true;
      std::__cxx11::string::operator=((string *)&this->cur_object,"trailer");
      setNextStateIfDictionary(this,(string *)value_local,local_20,st_trailer);
    }
    else {
      bVar1 = is_obj_key((string *)value_local,&local_190,&local_194);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->cur_object,(string *)value_local);
        bVar1 = setNextStateIfDictionary(this,(string *)value_local,local_20,st_object_top);
        if (bVar1) {
          getObjectForJSON((QPDF *)&local_1b8,(int)this->pdf,local_190);
          QPDFObjectHandle::QPDFObjectHandle(&local_1a8,&local_1b8);
          QPDFObjectHandle::operator=(&this->next_obj,&local_1a8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
          std::shared_ptr<QPDFObject>::~shared_ptr(&local_1b8);
        }
      }
      else {
        QTC::TC("qpdf","QPDF_json bad object key",0);
        qVar4 = JSON::getStart(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d8,"object key should be \"trailer\" or \"obj:n n R\"",
                   (allocator<char> *)((long)&tos + 7));
        error(this,qVar4,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tos + 7));
      }
    }
  }
  else if (local_30 == st_object_top) {
    bVar1 = std::
            vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
            empty(&this->stack);
    if (bVar1) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"stack empty in st_object_top");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_1f8._16_8_ =
         std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
         ::back(&this->stack);
    bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool
                      ((BaseHandle *)&((element_type *)local_1f8._16_8_)->last_offset);
    if (!bVar1) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"current object uninitialized in st_object_top");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"value");
    if (bVar1) {
      this->saw_value = true;
      makeObject((JSONReactor *)local_1f8,(JSON *)this);
      replaceObject(this,(QPDFObjectHandle *)local_1f8,local_20);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1f8);
      this->next_state = st_object;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"stream");
      if (bVar1) {
        this->saw_stream = true;
        bVar1 = setNextStateIfDictionary(this,(string *)value_local,local_20,st_stream);
        if (bVar1) {
          this->this_stream_needs_data = false;
          bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)(local_1f8._16_8_ + 8));
          if (bVar1) {
            QTC::TC("qpdf","QPDF_json updating existing stream",0);
          }
          else {
            this->this_stream_needs_data = true;
            qpdf = this->pdf;
            local_220 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)(local_1f8._16_8_ + 8));
            QPDFObjectHandle::newDictionary();
            ::qpdf::Stream::Stream(&local_218,qpdf,local_220,&local_230,0,0);
            ::qpdf::BaseHandle::operator_cast_to_QPDFObjectHandle(&local_208);
            replaceObject(this,(QPDFObjectHandle *)&local_208,local_20);
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_208);
            ::qpdf::Stream::~Stream(&local_218);
            QPDFObjectHandle::~QPDFObjectHandle(&local_230);
          }
          QPDFObjectHandle::operator=(&this->next_obj,(QPDFObjectHandle *)(local_1f8._16_8_ + 8));
        }
        else {
          QTC::TC("qpdf","QPDF_json stream not a dictionary",0);
        }
      }
      else {
        QTC::TC("qpdf","QPDF_json ignore unknown key in object_top",0);
      }
    }
  }
  else if (local_30 == st_trailer) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"value");
    if (bVar1) {
      this->saw_value = true;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"trailer.value",(allocator<char> *)(local_268 + 0x17));
      bVar1 = setNextStateIfDictionary(this,&local_250,local_20,st_object);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)(local_268 + 0x17));
      if (bVar1) {
        makeObject((JSONReactor *)local_268,(JSON *)this);
        pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->pdf->m);
        QPDFObjectHandle::operator=(&pMVar5->trailer,(QPDFObjectHandle *)local_268);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_268);
        pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->pdf->m);
        setObjectDescription(this,&pMVar5->trailer,local_20);
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"stream");
      if (bVar1) {
        QTC::TC("qpdf","QPDF_json trailer stream",0);
        qVar4 = JSON::getStart(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_288,"the trailer may not be a stream",
                   (allocator<char> *)((long)&tos_1 + 7));
        error(this,qVar4,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tos_1 + 7));
      }
      else {
        QTC::TC("qpdf","QPDF_json ignore unknown key in trailer",0);
      }
    }
  }
  else if (local_30 == st_stream) {
    bVar1 = std::
            vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
            empty(&this->stack);
    if (bVar1) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"stack empty in st_stream");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    uninitialized.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
         ::back(&this->stack);
    bVar1 = QPDFObjectHandle::isStream
                      (&((reference)
                        uninitialized.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->object);
    if (!bVar1) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"current object is not stream in st_stream");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    auStack_2a8 = (undefined1  [8])0x0;
    uninitialized.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)auStack_2a8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"dict");
    if (bVar1) {
      this->saw_dict = true;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,"stream.dict",(allocator<char> *)&stack0xfffffffffffffd37);
      bVar1 = setNextStateIfDictionary(this,&local_2c8,local_20,st_object);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd37);
      if (bVar1) {
        p_Var7 = &(uninitialized.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count;
        makeObject((JSONReactor *)((long)&v_4.field_2 + 8),(JSON *)this);
        QPDFObjectHandle::replaceDict
                  ((QPDFObjectHandle *)p_Var7,(QPDFObjectHandle *)((long)&v_4.field_2 + 8));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&v_4.field_2 + 8));
      }
      else {
        QTC::TC("qpdf","QPDF_json stream dict not dict",0);
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"data");
      if (bVar1) {
        this->saw_data = true;
        std::__cxx11::string::string((string *)local_300);
        bVar1 = JSON::getString(local_20,(string *)local_300);
        if (bVar1) {
          qVar4 = JSON::getStart(local_20);
          end = qVar4 + 1;
          qVar4 = JSON::getEnd(local_20);
          local_360 = qVar4 + -1;
          if (local_360 < end) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar6,"QPDF_json: JSON string length < 0");
            __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          p_Var7 = &(uninitialized.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count;
          this_00 = (shared_ptr<InputSource> *)((long)&filename.field_2 + 8);
          std::shared_ptr<InputSource>::shared_ptr(this_00,&this->is);
          provide_data(&local_380,this_00,end,local_360);
          QPDFObjectHandle::replaceStreamData
                    ((QPDFObjectHandle *)p_Var7,&local_380,(QPDFObjectHandle *)auStack_2a8,
                     (QPDFObjectHandle *)auStack_2a8);
          std::function<void_(Pipeline_*)>::~function(&local_380);
          std::shared_ptr<InputSource>::~shared_ptr
                    ((shared_ptr<InputSource> *)((long)&filename.field_2 + 8));
        }
        else {
          QTC::TC("qpdf","QPDF_json stream data not string",0);
          qVar4 = JSON::getStart(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_320,"\"stream.data\" must be a string",&local_321);
          error(this,qVar4,&local_320);
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator(&local_321);
          p_Var7 = &(uninitialized.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,"",(allocator<char> *)((long)&start + 7));
          QPDFObjectHandle::replaceStreamData
                    ((QPDFObjectHandle *)p_Var7,&local_348,(QPDFObjectHandle *)auStack_2a8,
                     (QPDFObjectHandle *)auStack_2a8);
          std::__cxx11::string::~string((string *)&local_348);
          std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
        }
        std::__cxx11::string::~string((string *)local_300);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,"datafile");
        if (bVar1) {
          this->saw_datafile = true;
          std::__cxx11::string::string((string *)local_3b0);
          bVar1 = JSON::getString(local_20,(string *)local_3b0);
          if (bVar1) {
            p_Var7 = &(uninitialized.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_M_use_count;
            QUtil::file_provider((function<void_(Pipeline_*)> *)&tos_2,(string *)local_3b0);
            QPDFObjectHandle::replaceStreamData
                      ((QPDFObjectHandle *)p_Var7,(function<void_(Pipeline_*)> *)&tos_2,
                       (QPDFObjectHandle *)auStack_2a8,(QPDFObjectHandle *)auStack_2a8);
            std::function<void_(Pipeline_*)>::~function((function<void_(Pipeline_*)> *)&tos_2);
          }
          else {
            QTC::TC("qpdf","QPDF_json stream datafile not string",0);
            qVar4 = JSON::getStart(local_20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d0,
                       "\"stream.datafile\" must be a string containing a file name",&local_3d1);
            error(this,qVar4,&local_3d0);
            std::__cxx11::string::~string((string *)&local_3d0);
            std::allocator<char>::~allocator(&local_3d1);
            p_Var7 = &(uninitialized.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_M_use_count;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"",&local_3f9);
            QPDFObjectHandle::replaceStreamData
                      ((QPDFObjectHandle *)p_Var7,&local_3f8,(QPDFObjectHandle *)auStack_2a8,
                       (QPDFObjectHandle *)auStack_2a8);
            std::__cxx11::string::~string((string *)&local_3f8);
            std::allocator<char>::~allocator(&local_3f9);
          }
          std::__cxx11::string::~string((string *)local_3b0);
        }
        else {
          QTC::TC("qpdf","QPDF_json ignore unknown key in stream",0);
        }
      }
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)auStack_2a8);
  }
  else {
    if (local_30 != st_object) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_518,local_30);
      std::operator+(&local_4f8,"QPDF_json: unknown state ",&local_518);
      std::logic_error::logic_error(plVar6,(string *)&local_4f8);
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    bVar1 = std::
            vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
            empty(&this->stack);
    if (bVar1) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"stack empty in st_object");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
             back(&this->stack);
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)local_438,
               &((reference)
                dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->object);
    bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_438);
    if (bVar1) {
      QPDFObjectHandle::getDict(&local_448);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)local_438,&local_448);
      QPDFObjectHandle::~QPDFObjectHandle(&local_448);
    }
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_438);
    if (!bVar1) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar6,"current object is not stream or dictionary in st_object dictionary item");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_499 = 0;
    local_4d8[0x16] = 0;
    local_4d8[0x15] = 0;
    local_4d8[0x14] = 0;
    bVar1 = is_pdf_name((string *)value_local);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&local_498,(ulong)value_local);
      local_499 = 1;
      std::allocator<char>::allocator();
      local_4d8[0x16] = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"",(allocator<char> *)(local_4d8 + 0x17));
      local_4d8[0x15] = 1;
      QPDFObjectHandle::parse(&local_478,&local_498,&local_4c0);
      local_4d8[0x14] = 1;
      QPDFObjectHandle::getName_abi_cxx11_(&local_468,&local_478);
    }
    else {
      std::__cxx11::string::string((string *)&local_468,(string *)value_local);
    }
    makeObject((JSONReactor *)local_4d8,(JSON *)this);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_438,&local_468,(QPDFObjectHandle *)local_4d8);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_4d8);
    std::__cxx11::string::~string((string *)&local_468);
    if ((local_4d8[0x14] & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_478);
    }
    if ((local_4d8[0x15] & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4c0);
    }
    if ((local_4d8[0x16] & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(local_4d8 + 0x17));
    }
    if ((local_499 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_498);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_438);
  }
  return true;
}

Assistant:

bool
QPDF::JSONReactor::dictionaryItem(std::string const& key, JSON const& value)
{
    if (stack.empty()) {
        throw std::logic_error("stack is empty in dictionaryItem");
    }
    next_state = st_ignore;
    auto state = stack.back().state;
    if (state == st_ignore) {
        QTC::TC("qpdf", "QPDF_json ignoring in st_ignore");
        // ignore
    } else if (state == st_top) {
        if (key == "qpdf") {
            this->saw_qpdf = true;
            if (!value.isArray()) {
                QTC::TC("qpdf", "QPDF_json qpdf not array");
                error(value.getStart(), "\"qpdf\" must be an array");
            } else {
                next_state = st_qpdf;
            }
        } else {
            // Ignore all other fields.
            QTC::TC("qpdf", "QPDF_json ignoring unknown top-level key");
        }
    } else if (state == st_qpdf_meta) {
        if (key == "pdfversion") {
            this->saw_pdf_version = true;
            std::string v;
            bool okay = false;
            if (value.getString(v)) {
                std::string version;
                char const* p = v.c_str();
                if (QPDF::validatePDFVersion(p, version) && (*p == '\0')) {
                    this->pdf.m->pdf_version = version;
                    okay = true;
                }
            }
            if (!okay) {
                QTC::TC("qpdf", "QPDF_json bad pdf version");
                error(value.getStart(), "invalid PDF version (must be \"x.y\")");
            }
        } else if (key == "jsonversion") {
            this->saw_json_version = true;
            std::string v;
            bool okay = false;
            if (value.getNumber(v)) {
                std::string version;
                if (QUtil::string_to_int(v.c_str()) == 2) {
                    okay = true;
                }
            }
            if (!okay) {
                QTC::TC("qpdf", "QPDF_json bad json version");
                error(value.getStart(), "invalid JSON version (must be numeric value 2)");
            }
        } else if (key == "pushedinheritedpageresources") {
            bool v;
            if (value.getBool(v)) {
                if (!this->must_be_complete && v) {
                    this->pdf.pushInheritedAttributesToPage();
                }
            } else {
                QTC::TC("qpdf", "QPDF_json bad pushedinheritedpageresources");
                error(value.getStart(), "pushedinheritedpageresources must be a boolean");
            }
        } else if (key == "calledgetallpages") {
            bool v;
            if (value.getBool(v)) {
                if (!this->must_be_complete && v) {
                    this->pdf.getAllPages();
                }
            } else {
                QTC::TC("qpdf", "QPDF_json bad calledgetallpages");
                error(value.getStart(), "calledgetallpages must be a boolean");
            }
        } else {
            // ignore unknown keys for forward compatibility and to skip keys we don't care about
            // like "maxobjectid".
            QTC::TC("qpdf", "QPDF_json ignore second-level key");
        }
    } else if (state == st_objects) {
        int obj = 0;
        int gen = 0;
        if (key == "trailer") {
            this->saw_trailer = true;
            this->cur_object = "trailer";
            setNextStateIfDictionary(key, value, st_trailer);
        } else if (is_obj_key(key, obj, gen)) {
            this->cur_object = key;
            if (setNextStateIfDictionary(key, value, st_object_top)) {
                next_obj = pdf.getObjectForJSON(obj, gen);
            }
        } else {
            QTC::TC("qpdf", "QPDF_json bad object key");
            error(value.getStart(), "object key should be \"trailer\" or \"obj:n n R\"");
        }
    } else if (state == st_object_top) {
        if (stack.empty()) {
            throw std::logic_error("stack empty in st_object_top");
        }
        auto& tos = stack.back();
        if (!tos.object) {
            throw std::logic_error("current object uninitialized in st_object_top");
        }
        if (key == "value") {
            // Don't use setNextStateIfDictionary since this can have any type.
            this->saw_value = true;
            replaceObject(makeObject(value), value);
            next_state = st_object;
        } else if (key == "stream") {
            this->saw_stream = true;
            if (setNextStateIfDictionary(key, value, st_stream)) {
                this->this_stream_needs_data = false;
                if (tos.object.isStream()) {
                    QTC::TC("qpdf", "QPDF_json updating existing stream");
                } else {
                    this_stream_needs_data = true;
                    replaceObject(
                        qpdf::Stream(
                            pdf, tos.object.getObjGen(), QPDFObjectHandle::newDictionary(), 0, 0),
                        value);
                }
                next_obj = tos.object;
            } else {
                // Error message already given above
                QTC::TC("qpdf", "QPDF_json stream not a dictionary");
            }
        } else {
            // Ignore unknown keys for forward compatibility
            QTC::TC("qpdf", "QPDF_json ignore unknown key in object_top");
        }
    } else if (state == st_trailer) {
        if (key == "value") {
            this->saw_value = true;
            // The trailer must be a dictionary, so we can use setNextStateIfDictionary.
            if (setNextStateIfDictionary("trailer.value", value, st_object)) {
                this->pdf.m->trailer = makeObject(value);
                setObjectDescription(this->pdf.m->trailer, value);
            }
        } else if (key == "stream") {
            // Don't need to set saw_stream here since there's already an error.
            QTC::TC("qpdf", "QPDF_json trailer stream");
            error(value.getStart(), "the trailer may not be a stream");
        } else {
            // Ignore unknown keys for forward compatibility
            QTC::TC("qpdf", "QPDF_json ignore unknown key in trailer");
        }
    } else if (state == st_stream) {
        if (stack.empty()) {
            throw std::logic_error("stack empty in st_stream");
        }
        auto& tos = stack.back();
        if (!tos.object.isStream()) {
            throw std::logic_error("current object is not stream in st_stream");
        }
        auto uninitialized = QPDFObjectHandle();
        if (key == "dict") {
            this->saw_dict = true;
            if (setNextStateIfDictionary("stream.dict", value, st_object)) {
                tos.object.replaceDict(makeObject(value));
            } else {
                // An error had already been given by setNextStateIfDictionary
                QTC::TC("qpdf", "QPDF_json stream dict not dict");
            }
        } else if (key == "data") {
            this->saw_data = true;
            std::string v;
            if (!value.getString(v)) {
                QTC::TC("qpdf", "QPDF_json stream data not string");
                error(value.getStart(), "\"stream.data\" must be a string");
                tos.object.replaceStreamData("", uninitialized, uninitialized);
            } else {
                // The range includes the quotes.
                auto start = value.getStart() + 1;
                auto end = value.getEnd() - 1;
                if (end < start) {
                    throw std::logic_error("QPDF_json: JSON string length < 0");
                }
                tos.object.replaceStreamData(
                    provide_data(is, start, end), uninitialized, uninitialized);
            }
        } else if (key == "datafile") {
            this->saw_datafile = true;
            std::string filename;
            if (!value.getString(filename)) {
                QTC::TC("qpdf", "QPDF_json stream datafile not string");
                error(
                    value.getStart(),
                    "\"stream.datafile\" must be a string containing a file name");
                tos.object.replaceStreamData("", uninitialized, uninitialized);
            } else {
                tos.object.replaceStreamData(
                    QUtil::file_provider(filename), uninitialized, uninitialized);
            }
        } else {
            // Ignore unknown keys for forward compatibility.
            QTC::TC("qpdf", "QPDF_json ignore unknown key in stream");
        }
    } else if (state == st_object) {
        if (stack.empty()) {
            throw std::logic_error("stack empty in st_object");
        }
        auto& tos = stack.back();
        auto dict = tos.object;
        if (dict.isStream()) {
            dict = dict.getDict();
        }
        if (!dict.isDictionary()) {
            throw std::logic_error(
                "current object is not stream or dictionary in st_object dictionary item");
        }
        dict.replaceKey(
            is_pdf_name(key) ? QPDFObjectHandle::parse(key.substr(2)).getName() : key,
            makeObject(value));
    } else {
        throw std::logic_error("QPDF_json: unknown state " + std::to_string(state));
    }
    return true;
}